

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O1

bool __thiscall AmpIO::GetAmpEnable(AmpIO *this,uint index)

{
  uint32_t uVar1;
  uint uVar2;
  
  if (index < this->NumMotors) {
    uVar1 = BoardIO::GetFirmwareVersion((BoardIO *)this);
    if (uVar1 < 8) {
      uVar2 = 1 << ((byte)index & 0x1f) & this->ReadBuffer[1];
    }
    else {
      uVar2 = this->ReadBuffer[index + this->MOTOR_STATUS_OFFSET] & 0x10000000;
    }
    return uVar2 != 0;
  }
  return false;
}

Assistant:

bool AmpIO::GetAmpEnable(unsigned int index) const
{
    if (index >= NumMotors)
        return false;

    bool ret;
    if (GetFirmwareVersion() < 8) {
        uint32_t mask = (0x00000001 << index);
        ret = GetStatus()&mask;
    }
    else {
        ret = ReadBuffer[MOTOR_STATUS_OFFSET + index] & MSTAT_AMP_REQ;
    }
    return ret;
}